

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

void anon_unknown.dwarf_13061b0::AddInstallRuntimeDependenciesGenerator
               (Helper *helper,cmInstallRuntimeDependencySet *runtimeDependencySet,
               cmInstallCommandArguments *runtimeArgs,cmInstallCommandArguments *libraryArgs,
               cmInstallCommandArguments *frameworkArgs,
               RuntimeDependenciesArgs *runtimeDependenciesArgs,bool *installsRuntime,
               bool *installsLibrary,bool *installsFramework)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  string *psVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  string *psVar8;
  string *__args_13;
  long lVar9;
  ulong uVar10;
  cmInstallCommandArguments *this;
  pointer __x;
  undefined1 local_123 [3];
  Helper *local_120;
  string local_118;
  int local_f4;
  MessageLevel local_f0;
  undefined1 local_ec [4];
  cmListFileBacktrace local_e8;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_d8;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_d0;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_b8;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_b0;
  size_type local_a8;
  cmInstallRuntimeDependencySet *runtimeDependencySet_local;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_68;
  cmInstallCommandArguments *local_58;
  cmInstallCommandArguments *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  
  pcVar1 = helper->Makefile;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_120 = helper;
  local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)frameworkArgs;
  runtimeDependencySet_local = runtimeDependencySet;
  local_58 = libraryArgs;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"CMAKE_IMPORT_LIBRARY_SUFFIX","");
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_118);
  local_a8 = psVar5->_M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  pcVar1 = local_120->Makefile;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"CMAKE_HOST_SYSTEM_NAME","");
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_118);
  local_f4 = std::__cxx11::string::compare((char *)psVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  this = runtimeArgs;
  if (local_a8 == 0) {
    this = local_58;
  }
  local_50 = runtimeArgs;
  pvVar6 = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&configurations,pvVar6);
  _Var3._M_pi = local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_f4 == 0) {
    pvVar6 = cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                       ((cmInstallCommandArguments *)
                        local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                        .
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi);
    __x = (pvVar6->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                       ((cmInstallCommandArguments *)_Var3._M_pi);
    lVar9 = (long)(pvVar6->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)__x >> 5;
    if (0 < lVar9) {
      uVar10 = lVar9 + 1;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&configurations,__x);
        __x = __x + 1;
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    }
  }
  psVar5 = cmInstallCommandArguments::GetComponent_abi_cxx11_(this);
  if (local_f4 == 0) {
    psVar8 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                       ((cmInstallCommandArguments *)
                        local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                        .
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    pcVar2 = (psVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar2,pcVar2 + psVar8->_M_string_length);
  }
  else {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  local_c8._M_head_impl._0_1_ = 1;
  local_78._M_allocated_capacity._0_4_ =
       cmInstallGenerator::SelectMessageLevel(local_120->Makefile,false);
  bVar4 = cmInstallCommandArguments::GetExcludeFromAll(this);
  if (bVar4 && local_f4 == 0) {
    bVar4 = cmInstallCommandArguments::GetExcludeFromAll
                      ((cmInstallCommandArguments *)
                       local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
  }
  local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            CONCAT71(local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr._1_7_,bVar4);
  cmMakefile::GetBacktrace(local_120->Makefile);
  std::
  make_unique<cmInstallGetRuntimeDependenciesGenerator,cmInstallRuntimeDependencySet*&,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string_const&,std::__cxx11::string_const,bool,char_const(&)[12],char_const(&)[13],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,cmInstallGenerator::MessageLevel,bool,cmListFileBacktrace>
            ((cmInstallRuntimeDependencySet **)&local_b0,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&runtimeDependencySet_local,&runtimeDependenciesArgs->Directories,
             &runtimeDependenciesArgs->PreIncludeRegexes,&runtimeDependenciesArgs->PreExcludeRegexes
             ,&runtimeDependenciesArgs->PostIncludeRegexes,
             &runtimeDependenciesArgs->PostExcludeRegexes,&runtimeDependenciesArgs->PostIncludeFiles
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &runtimeDependenciesArgs->PostExcludeFiles,psVar5,(bool *)&local_118,
             (char (*) [12])&local_c8,(char (*) [13])"_CMAKE_DEPS",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)"_CMAKE_RPATH",(MessageLevel *)&configurations,(bool *)local_78._M_local_buf,
             &local_e8);
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  local_b8._M_head_impl = local_b0._M_head_impl;
  local_b0._M_head_impl = (cmInstallGenerator *)0x0;
  cmMakefile::AddInstallGenerator
            (local_120->Makefile,
             (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)&local_b8);
  if (local_b8._M_head_impl != (cmInstallGenerator *)0x0) {
    (*((local_b8._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
  }
  local_b8._M_head_impl = (cmInstallGenerator *)0x0;
  local_ec = (undefined1  [4])0x0;
  local_68 = 0;
  local_78._M_allocated_capacity = 0;
  local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_123[2] = 1;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_123[1] = 1;
  if (local_a8 == 0) {
    (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
              ((string *)local_98,local_120,local_58);
  }
  else {
    (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
              ((string *)local_98,local_120,local_50);
  }
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           cmInstallCommandArguments::GetConfigurations_abi_cxx11_(this);
  psVar5 = cmInstallCommandArguments::GetComponent_abi_cxx11_(this);
  psVar8 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(this);
  local_f0 = cmInstallGenerator::SelectMessageLevel(local_120->Makefile,false);
  local_123[0] = cmInstallCommandArguments::GetExcludeFromAll(this);
  cmMakefile::GetBacktrace(local_120->Makefile);
  std::
  make_unique<cmInstallRuntimeDependencySetGenerator,cmInstallRuntimeDependencySetGenerator::DependencyType,cmInstallRuntimeDependencySet*&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,std::__cxx11::string,bool,char_const(&)[12],char_const(&)[13],char_const(&)[11],std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel,bool,cmListFileBacktrace>
            ((DependencyType *)&local_e8,(cmInstallRuntimeDependencySet **)local_ec,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&runtimeDependencySet_local,(bool *)local_78._M_local_buf,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_123 + 2),
             (bool *)&local_118,(char (*) [12])(local_123 + 1),(char (*) [13])"_CMAKE_DEPS",
             (char (*) [11])"_CMAKE_RPATH",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_CMAKE_TMP",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_98,pbVar7,psVar5,(MessageLevel *)psVar8,(bool *)&local_f0,
             (cmListFileBacktrace *)local_123);
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_78);
  local_d0._M_head_impl =
       (cmInstallGenerator *)
       local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  cmMakefile::AddInstallGenerator
            (local_120->Makefile,
             (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)&local_d0);
  if (local_d0._M_head_impl != (cmInstallGenerator *)0x0) {
    (**(code **)((((string *)
                  &((local_d0._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator)->
                 _M_dataplus)._M_p + 8))();
  }
  _Var3._M_pi = local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_a8 == 0) {
    installsRuntime = installsLibrary;
  }
  local_d0._M_head_impl = (cmInstallGenerator *)0x0;
  *installsRuntime = true;
  if (local_f4 == 0) {
    local_ec = (undefined1  [4])0x1;
    local_98._16_8_ = 0;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (pointer)0x0;
    local_123[2] = 1;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    local_123[1] = 1;
    psVar5 = cmInstallCommandArguments::GetDestination_abi_cxx11_
                       ((cmInstallCommandArguments *)
                        local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                        .
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                       ((cmInstallCommandArguments *)_Var3._M_pi);
    psVar8 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                       ((cmInstallCommandArguments *)_Var3._M_pi);
    __args_13 = cmInstallCommandArguments::GetPermissions_abi_cxx11_
                          ((cmInstallCommandArguments *)_Var3._M_pi);
    local_f0 = cmInstallGenerator::SelectMessageLevel(local_120->Makefile,false);
    local_123[0] = cmInstallCommandArguments::GetExcludeFromAll
                             ((cmInstallCommandArguments *)
                              local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                              TopEntry.
                              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
    cmMakefile::GetBacktrace(local_120->Makefile);
    std::
    make_unique<cmInstallRuntimeDependencySetGenerator,cmInstallRuntimeDependencySetGenerator::DependencyType,cmInstallRuntimeDependencySet*&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,std::__cxx11::string,bool,char_const(&)[12],char_const(&)[13],char_const(&)[11],std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel,bool,cmListFileBacktrace>
              ((DependencyType *)&local_c8,(cmInstallRuntimeDependencySet **)local_ec,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&runtimeDependencySet_local,(bool *)local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_123 + 2),
               (bool *)&local_118,(char (*) [12])(local_123 + 1),(char (*) [13])"_CMAKE_DEPS",
               (char (*) [11])"_CMAKE_RPATH",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_CMAKE_TMP",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)psVar5,pbVar7,psVar8,(MessageLevel *)__args_13,(bool *)&local_f0,
               (cmListFileBacktrace *)local_123);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
    local_d8._M_head_impl = local_c8._M_head_impl;
    local_c8._M_head_impl = (cmInstallGenerator *)0x0;
    cmMakefile::AddInstallGenerator
              (local_120->Makefile,
               (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)&local_d8
              );
    if (local_d8._M_head_impl != (cmInstallGenerator *)0x0) {
      (*((local_d8._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
    }
    local_d8._M_head_impl = (cmInstallGenerator *)0x0;
    *installsFramework = true;
    if (local_c8._M_head_impl != (cmInstallGenerator *)0x0) {
      (*((local_c8._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
    }
  }
  if (local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    (**(code **)(((local_e8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->Value).Name._M_dataplus._M_p + 8))();
  }
  if (local_b0._M_head_impl != (cmInstallGenerator *)0x0) {
    (*((local_b0._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configurations);
  return;
}

Assistant:

void AddInstallRuntimeDependenciesGenerator(
  Helper& helper, cmInstallRuntimeDependencySet* runtimeDependencySet,
  const cmInstallCommandArguments& runtimeArgs,
  const cmInstallCommandArguments& libraryArgs,
  const cmInstallCommandArguments& frameworkArgs,
  RuntimeDependenciesArgs runtimeDependenciesArgs, bool& installsRuntime,
  bool& installsLibrary, bool& installsFramework)
{
  bool dllPlatform =
    !helper.Makefile->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX").empty();
  bool apple =
    helper.Makefile->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME") == "Darwin";
  auto const& runtimeDependenciesArgsRef =
    dllPlatform ? runtimeArgs : libraryArgs;
  std::vector<std::string> configurations =
    runtimeDependenciesArgsRef.GetConfigurations();
  if (apple) {
    std::copy(frameworkArgs.GetConfigurations().begin(),
              frameworkArgs.GetConfigurations().end(),
              std::back_inserter(configurations));
  }

  // Create file(GET_RUNTIME_DEPENDENCIES) generator.
  auto getRuntimeDependenciesGenerator =
    cm::make_unique<cmInstallGetRuntimeDependenciesGenerator>(
      runtimeDependencySet, std::move(runtimeDependenciesArgs.Directories),
      std::move(runtimeDependenciesArgs.PreIncludeRegexes),
      std::move(runtimeDependenciesArgs.PreExcludeRegexes),
      std::move(runtimeDependenciesArgs.PostIncludeRegexes),
      std::move(runtimeDependenciesArgs.PostExcludeRegexes),
      std::move(runtimeDependenciesArgs.PostIncludeFiles),
      std::move(runtimeDependenciesArgs.PostExcludeFiles),
      runtimeDependenciesArgsRef.GetComponent(),
      apple ? frameworkArgs.GetComponent() : "", true, "_CMAKE_DEPS",
      "_CMAKE_RPATH", configurations,
      cmInstallGenerator::SelectMessageLevel(helper.Makefile),
      runtimeDependenciesArgsRef.GetExcludeFromAll() &&
        (apple ? frameworkArgs.GetExcludeFromAll() : true),
      helper.Makefile->GetBacktrace());
  helper.Makefile->AddInstallGenerator(
    std::move(getRuntimeDependenciesGenerator));

  // Create the library dependencies generator.
  auto libraryRuntimeDependenciesGenerator =
    cm::make_unique<cmInstallRuntimeDependencySetGenerator>(
      cmInstallRuntimeDependencySetGenerator::DependencyType::Library,
      runtimeDependencySet, std::vector<std::string>{}, true, std::string{},
      true, "_CMAKE_DEPS", "_CMAKE_RPATH", "_CMAKE_TMP",
      dllPlatform ? helper.GetRuntimeDestination(&runtimeArgs)
                  : helper.GetLibraryDestination(&libraryArgs),
      runtimeDependenciesArgsRef.GetConfigurations(),
      runtimeDependenciesArgsRef.GetComponent(),
      runtimeDependenciesArgsRef.GetPermissions(),
      cmInstallGenerator::SelectMessageLevel(helper.Makefile),
      runtimeDependenciesArgsRef.GetExcludeFromAll(),
      helper.Makefile->GetBacktrace());
  helper.Makefile->AddInstallGenerator(
    std::move(libraryRuntimeDependenciesGenerator));
  if (dllPlatform) {
    installsRuntime = true;
  } else {
    installsLibrary = true;
  }

  if (apple) {
    // Create the framework dependencies generator.
    auto frameworkRuntimeDependenciesGenerator =
      cm::make_unique<cmInstallRuntimeDependencySetGenerator>(
        cmInstallRuntimeDependencySetGenerator::DependencyType::Framework,
        runtimeDependencySet, std::vector<std::string>{}, true, std::string{},
        true, "_CMAKE_DEPS", "_CMAKE_RPATH", "_CMAKE_TMP",
        frameworkArgs.GetDestination(), frameworkArgs.GetConfigurations(),
        frameworkArgs.GetComponent(), frameworkArgs.GetPermissions(),
        cmInstallGenerator::SelectMessageLevel(helper.Makefile),
        frameworkArgs.GetExcludeFromAll(), helper.Makefile->GetBacktrace());
    helper.Makefile->AddInstallGenerator(
      std::move(frameworkRuntimeDependenciesGenerator));
    installsFramework = true;
  }
}